

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nsf_Emu.cpp
# Opt level: O2

void __thiscall Nsf_Emu::update_eq(Nsf_Emu *this,blip_eq_t *eq)

{
  Nes_Apu::treble_eq(&this->apu,eq);
  if (this->namco != (Nes_Namco_Apu *)0x0) {
    Blip_Synth_::treble_eq(&(this->namco->synth).impl,eq);
  }
  if (this->vrc6 != (Nes_Vrc6_Apu *)0x0) {
    Nes_Vrc6_Apu::treble_eq(this->vrc6,eq);
  }
  if (this->fme7 != (Nes_Fme7_Apu *)0x0) {
    Blip_Synth_::treble_eq(&(this->fme7->synth).impl,eq);
    return;
  }
  return;
}

Assistant:

void Nsf_Emu::update_eq( blip_eq_t const& eq )
{
	apu.treble_eq( eq );
	
	#if !NSF_EMU_APU_ONLY
	{
		if ( namco ) namco->treble_eq( eq );
		if ( vrc6  ) vrc6 ->treble_eq( eq );
		if ( fme7  ) fme7 ->treble_eq( eq );
	}
	#endif
}